

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::AndroidZoneInfoSource::
~AndroidZoneInfoSource(AndroidZoneInfoSource *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _IO_FILE *p_Var3;
  
  (this->super_FileZoneInfoSource).super_ZoneInfoSource._vptr_ZoneInfoSource =
       (_func_int **)&PTR__AndroidZoneInfoSource_0056f818;
  pcVar2 = (this->version_)._M_dataplus._M_p;
  paVar1 = &(this->version_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_FileZoneInfoSource).super_ZoneInfoSource._vptr_ZoneInfoSource =
       (_func_int **)&PTR__FileZoneInfoSource_0056f7b0;
  p_Var3 = (this->super_FileZoneInfoSource).fp_._M_t.
           super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
           super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
           super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
  if (p_Var3 != (_IO_FILE *)0x0) {
    (*(this->super_FileZoneInfoSource).fp_._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>
      ._M_t.super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
      super__Tuple_impl<1UL,_int_(*)(_IO_FILE_*)>.super__Head_base<1UL,_int_(*)(_IO_FILE_*),_false>.
      _M_head_impl)(p_Var3);
  }
  (this->super_FileZoneInfoSource).fp_._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>.
  _M_t.super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
  super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl = (_IO_FILE *)0x0;
  ZoneInfoSource::~ZoneInfoSource((ZoneInfoSource *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

std::string Version() const override { return version_; }